

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accessors.h
# Opt level: O2

uint32_t upb_Message_WhichOneofFieldNumber(upb_Message *message,upb_MiniTableField *oneof_field)

{
  size_t sVar1;
  
  if (oneof_field->presence < 0) {
    sVar1 = _upb_MiniTableField_OneofOffset_dont_copy_me__upb_internal_use_only(oneof_field);
    return *(uint32_t *)((long)&message->field_0 + sVar1);
  }
  __assert_fail("upb_MiniTableField_IsInOneof(oneof_field)",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                ,0x79,
                "uint32_t upb_Message_WhichOneofFieldNumber(const struct upb_Message *, const upb_MiniTableField *)"
               );
}

Assistant:

UPB_API_INLINE uint32_t upb_Message_WhichOneofFieldNumber(
    const struct upb_Message* message, const upb_MiniTableField* oneof_field) {
  UPB_ASSUME(upb_MiniTableField_IsInOneof(oneof_field));
  return UPB_PRIVATE(_upb_Message_GetOneofCase)(message, oneof_field);
}